

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall QTextDocumentPrivate::insert_frame(QTextDocumentPrivate *this,QTextFrame *f)

{
  QTextFrame *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  QTextFrame *pQVar4;
  ulong i_00;
  long lVar5;
  int i;
  ulong uVar6;
  
  iVar1 = QTextFrame::firstPosition(f);
  iVar2 = QTextFrame::lastPosition(f);
  pQVar4 = frameAt(this,iVar1 + -1);
  if (iVar1 != iVar2) {
    for (uVar6 = 0; lVar5 = *(long *)&(pQVar4->super_QTextObject).field_0x8,
        uVar6 < *(ulong *)(lVar5 + 0xa8); uVar6 = uVar6 + 1) {
      this_00 = *(QTextFrame **)(*(long *)(lVar5 + 0xa0) + uVar6 * 8);
      iVar3 = QTextFrame::firstPosition(this_00);
      if (iVar1 < iVar3) {
        iVar3 = QTextFrame::lastPosition(this_00);
        if (iVar3 < iVar2) {
          QList<QTextFrame_*>::removeAt
                    ((QList<QTextFrame_*> *)(*(long *)&(pQVar4->super_QTextObject).field_0x8 + 0x98)
                     ,uVar6);
          QList<QTextFrame_*>::append
                    ((QList<QTextFrame_*> *)(*(long *)&(f->super_QTextObject).field_0x8 + 0x98),
                     this_00);
          *(QTextFrame **)(*(long *)&(this_00->super_QTextObject).field_0x8 + 0x90) = f;
        }
      }
    }
  }
  uVar6 = 0;
  do {
    i_00 = uVar6;
    lVar5 = *(long *)&(pQVar4->super_QTextObject).field_0x8;
    if (*(ulong *)(lVar5 + 0xa8) <= i_00) goto LAB_00462184;
    iVar1 = QTextFrame::firstPosition(*(QTextFrame **)(*(long *)(lVar5 + 0xa0) + i_00 * 8));
    uVar6 = i_00 + 1;
  } while (iVar1 <= iVar2);
  lVar5 = *(long *)&(pQVar4->super_QTextObject).field_0x8;
LAB_00462184:
  QList<QTextFrame_*>::insert((QList<QTextFrame_*> *)(lVar5 + 0x98),i_00,f);
  *(QTextFrame **)(*(long *)&(f->super_QTextObject).field_0x8 + 0x90) = pQVar4;
  return;
}

Assistant:

void QTextDocumentPrivate::insert_frame(QTextFrame *f)
{
    int start = f->firstPosition();
    int end = f->lastPosition();
    QTextFrame *parent = frameAt(start-1);
    Q_ASSERT(parent == frameAt(end+1));

    if (start != end) {
        // iterator over the parent and move all children contained in my frame to myself
        for (int i = 0; i < parent->d_func()->childFrames.size(); ++i) {
            QTextFrame *c = parent->d_func()->childFrames.at(i);
            if (start < c->firstPosition() && end > c->lastPosition()) {
                parent->d_func()->childFrames.removeAt(i);
                f->d_func()->childFrames.append(c);
                c->d_func()->parentFrame = f;
            }
        }
    }
    // insert at the correct position
    int i = 0;
    for (; i < parent->d_func()->childFrames.size(); ++i) {
        QTextFrame *c = parent->d_func()->childFrames.at(i);
        if (c->firstPosition() > end)
            break;
    }
    parent->d_func()->childFrames.insert(i, f);
    f->d_func()->parentFrame = parent;
}